

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnMemory
          (BinaryReaderIR *this,Index index,Limits *page_limits)

{
  undefined2 uVar1;
  Module *this_00;
  pointer pMVar2;
  unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> local_60;
  Memory *local_58;
  Memory *memory;
  undefined1 local_30 [8];
  __single_object field;
  Limits *page_limits_local;
  Index index_local;
  BinaryReaderIR *this_local;
  
  field._M_t.
  super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>._M_t
  .super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>.
  super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>,_true,_true>
        )(__uniq_ptr_data<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>,_true,_true>
          )page_limits;
  GetLocation((Location *)&memory,this);
  std::make_unique<wabt::MemoryModuleField,wabt::Location>((Location *)local_30);
  pMVar2 = std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
           operator->((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       *)local_30);
  local_58 = &pMVar2->memory;
  (pMVar2->memory).page_limits.initial =
       *(uint64_t *)
        field._M_t.
        super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
        ._M_t.
        super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
        .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl;
  (pMVar2->memory).page_limits.max =
       *(uint64_t *)
        ((long)field._M_t.
               super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
               ._M_t.
               super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
               .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 8);
  uVar1 = *(undefined2 *)
           ((long)field._M_t.
                  super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                  .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x10);
  (pMVar2->memory).page_limits.has_max = (bool)(char)uVar1;
  (pMVar2->memory).page_limits.is_shared = (bool)(char)((ushort)uVar1 >> 8);
  (pMVar2->memory).page_limits.is_64 =
       *(bool *)((long)field._M_t.
                       super___uniq_ptr_impl<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::MemoryModuleField_*,_std::default_delete<wabt::MemoryModuleField>_>
                       .super__Head_base<0UL,_wabt::MemoryModuleField_*,_false>._M_head_impl + 0x12)
  ;
  this_00 = this->module_;
  std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
  unique_ptr(&local_60,
             (unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> *)
             local_30);
  Module::AppendField(this_00,&local_60);
  std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
  ~unique_ptr(&local_60);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  std::unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>::
  ~unique_ptr((unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_> *)
              local_30);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::OnMemory(Index index, const Limits* page_limits) {
  auto field = std::make_unique<MemoryModuleField>(GetLocation());
  Memory& memory = field->memory;
  memory.page_limits = *page_limits;
  module_->AppendField(std::move(field));
  return Result::Ok;
}